

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa_common.h
# Opt level: O0

void init_alsa_device(int argc,char **argv,size_t default_period_size,size_t default_buffer_size,
                     int mode,snd_pcm_t **out_device,size_t *out_period_size,uint *out_rate,
                     snd_pcm_format_t *out_format)

{
  FILE *pFVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  long in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  undefined4 in_R8D;
  undefined8 *in_R9;
  long *in_stack_00000008;
  uint *in_stack_00000010;
  int *in_stack_00000018;
  int ret_14;
  int ret_13;
  int ret_12;
  int ret_11;
  int ret_10;
  int ret_9;
  int ret_8;
  int ret_7;
  int ret_6;
  int ret_5;
  int ret_4;
  int ret_3;
  int ret_2;
  int ret_1;
  int ret;
  size_t i;
  snd_pcm_format_t format;
  uint rate;
  uint channels;
  size_t period_size;
  size_t buffer_size;
  char *devicename;
  void *params;
  snd_pcm_t *device;
  char *local_138;
  ulong local_70;
  int local_64;
  uint local_60;
  long local_58;
  long local_50;
  char *local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 *local_30;
  undefined4 local_24;
  undefined8 *local_10;
  int local_4;
  
  local_48 = "default";
  local_60 = 48000;
  local_64 = 0xe;
  local_70 = 1;
  local_58 = in_RDX;
  local_50 = in_RCX;
  local_30 = in_R9;
  local_24 = in_R8D;
  local_10 = in_RSI;
  local_4 = in_EDI;
  do {
    if (((ulong)(long)local_4 <= local_70) ||
       (iVar2 = strcmp((char *)local_10[local_70],"--"), iVar2 == 0)) goto LAB_00102ac6;
    iVar2 = strcmp((char *)local_10[local_70],"--device");
    if (iVar2 == 0) {
      if ((long)local_4 == local_70 + 1) {
        fprintf(_stderr,"%s: expected argument after %s\n",*local_10,local_10[local_70]);
        fflush(_stderr);
        exit(1);
      }
      local_48 = (char *)local_10[local_70 + 1];
    }
    else {
      iVar2 = strcmp((char *)local_10[local_70],"--buffer-size");
      if (iVar2 == 0) {
        if ((long)local_4 == local_70 + 1) {
          fprintf(_stderr,"%s: expected argument after %s\n",*local_10,local_10[local_70]);
          fflush(_stderr);
          exit(1);
        }
        local_50 = strtol((char *)local_10[local_70 + 1],(char **)0x0,0);
      }
      else {
        iVar2 = strcmp((char *)local_10[local_70],"--period-size");
        if (iVar2 == 0) {
          if ((long)local_4 == local_70 + 1) {
            fprintf(_stderr,"%s: expected argument after %s\n",*local_10,local_10[local_70]);
            fflush(_stderr);
            exit(1);
          }
          local_58 = strtol((char *)local_10[local_70 + 1],(char **)0x0,0);
        }
        else {
          iVar2 = strcmp((char *)local_10[local_70],"--rate");
          if (iVar2 == 0) {
            if ((long)local_4 == local_70 + 1) {
              fprintf(_stderr,"%s: expected argument after %s\n",*local_10,local_10[local_70]);
              fflush(_stderr);
              exit(1);
            }
            lVar3 = strtol((char *)local_10[local_70 + 1],(char **)0x0,0);
            local_60 = (uint)lVar3;
          }
          else {
            iVar2 = strcmp((char *)local_10[local_70],"--format");
            if (iVar2 != 0) {
LAB_00102ac6:
              iVar2 = snd_pcm_open(&local_38,local_48,0,local_24);
              if ((iVar2 < 0) &&
                 (iVar2 = snd_pcm_recover(local_38,iVar2,0), pFVar1 = _stderr, iVar2 < 0)) {
                uVar4 = snd_strerror(iVar2);
                fprintf(pFVar1,"%s(%i) ALSA internal error : %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/alsa_common.h"
                        ,0x7e,uVar4);
                fflush(_stderr);
                exit(1);
              }
              iVar2 = snd_pcm_hw_params_malloc(&local_40);
              if ((iVar2 < 0) &&
                 (iVar2 = snd_pcm_recover(local_38,iVar2,0), pFVar1 = _stderr, iVar2 < 0)) {
                uVar4 = snd_strerror(iVar2);
                fprintf(pFVar1,"%s(%i) ALSA internal error : %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/alsa_common.h"
                        ,0x7f,uVar4);
                fflush(_stderr);
                exit(1);
              }
              iVar2 = snd_pcm_hw_params_any(local_38,local_40);
              if ((iVar2 < 0) &&
                 (iVar2 = snd_pcm_recover(local_38,iVar2,0), pFVar1 = _stderr, iVar2 < 0)) {
                uVar4 = snd_strerror(iVar2);
                fprintf(pFVar1,"%s(%i) ALSA internal error : %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/alsa_common.h"
                        ,0x80,uVar4);
                fflush(_stderr);
                exit(1);
              }
              iVar2 = snd_pcm_hw_params_set_access(local_38,local_40,3);
              if ((iVar2 < 0) &&
                 (iVar2 = snd_pcm_recover(local_38,iVar2,0), pFVar1 = _stderr, iVar2 < 0)) {
                uVar4 = snd_strerror(iVar2);
                fprintf(pFVar1,"%s(%i) ALSA internal error : %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/alsa_common.h"
                        ,0x81,uVar4);
                fflush(_stderr);
                exit(1);
              }
              iVar2 = snd_pcm_hw_params_set_format(local_38,local_40,local_64);
              if (iVar2 < 0) {
                local_64 = 0xe;
                iVar2 = snd_pcm_hw_params_set_format(local_38,local_40,0xe);
                if (iVar2 < 0) {
                  local_64 = 10;
                  iVar2 = snd_pcm_hw_params_set_format(local_38,local_40,10);
                  if (iVar2 < 0) {
                    local_64 = 2;
                    iVar2 = snd_pcm_hw_params_set_format(local_38,local_40,2);
                    if ((iVar2 < 0) &&
                       (iVar2 = snd_pcm_recover(local_38,iVar2,0), pFVar1 = _stderr, iVar2 < 0)) {
                      uVar4 = snd_strerror(iVar2);
                      fprintf(pFVar1,"%s(%i) ALSA internal error : %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/alsa_common.h"
                              ,0x86,uVar4);
                      fflush(_stderr);
                      exit(1);
                    }
                  }
                }
              }
              iVar2 = snd_pcm_hw_params_set_rate(local_38,local_40,local_60,0);
              if (iVar2 < 0) {
                local_60 = 48000;
                iVar2 = snd_pcm_hw_params_set_rate(local_38,local_40,48000,0);
                if (iVar2 < 0) {
                  local_60 = 0xac44;
                  iVar2 = snd_pcm_hw_params_set_rate(local_38,local_40,0xac44,0);
                  if ((iVar2 < 0) &&
                     (iVar2 = snd_pcm_recover(local_38,iVar2,0), pFVar1 = _stderr, iVar2 < 0)) {
                    uVar4 = snd_strerror(iVar2);
                    fprintf(pFVar1,"%s(%i) ALSA internal error : %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/alsa_common.h"
                            ,0x8b,uVar4);
                    fflush(_stderr);
                    exit(1);
                  }
                }
              }
              iVar2 = snd_pcm_hw_params_set_channels(local_38,local_40,2);
              if ((iVar2 < 0) &&
                 (iVar2 = snd_pcm_recover(local_38,iVar2,0), pFVar1 = _stderr, iVar2 < 0)) {
                uVar4 = snd_strerror(iVar2);
                fprintf(pFVar1,"%s(%i) ALSA internal error : %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/alsa_common.h"
                        ,0x8e,uVar4);
                fflush(_stderr);
                exit(1);
              }
              iVar2 = snd_pcm_hw_params_set_buffer_size_near(local_38,local_40,&local_50);
              if ((iVar2 < 0) &&
                 (iVar2 = snd_pcm_recover(local_38,iVar2,0), pFVar1 = _stderr, iVar2 < 0)) {
                uVar4 = snd_strerror(iVar2);
                fprintf(pFVar1,"%s(%i) ALSA internal error : %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/alsa_common.h"
                        ,0x90,uVar4);
                fflush(_stderr);
                exit(1);
              }
              iVar2 = snd_pcm_hw_params_set_period_size_near(local_38,local_40,&local_58,0);
              if ((iVar2 < 0) &&
                 (iVar2 = snd_pcm_recover(local_38,iVar2,0), pFVar1 = _stderr, iVar2 < 0)) {
                uVar4 = snd_strerror(iVar2);
                fprintf(pFVar1,"%s(%i) ALSA internal error : %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/alsa_common.h"
                        ,0x91,uVar4);
                fflush(_stderr);
                exit(1);
              }
              iVar2 = snd_pcm_hw_params(local_38,local_40);
              if ((iVar2 < 0) &&
                 (iVar2 = snd_pcm_recover(local_38,iVar2,0), pFVar1 = _stderr, iVar2 < 0)) {
                uVar4 = snd_strerror(iVar2);
                fprintf(pFVar1,"%s(%i) ALSA internal error : %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/alsa_common.h"
                        ,0x92,uVar4);
                fflush(_stderr);
                exit(1);
              }
              snd_pcm_hw_params_free(local_40);
              iVar2 = snd_pcm_sw_params_malloc(&local_40);
              if ((iVar2 < 0) &&
                 (iVar2 = snd_pcm_recover(local_38,iVar2,0), pFVar1 = _stderr, iVar2 < 0)) {
                uVar4 = snd_strerror(iVar2);
                fprintf(pFVar1,"%s(%i) ALSA internal error : %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/alsa_common.h"
                        ,0x95,uVar4);
                fflush(_stderr);
                exit(1);
              }
              iVar2 = snd_pcm_sw_params_current(local_38,local_40);
              if ((iVar2 < 0) &&
                 (iVar2 = snd_pcm_recover(local_38,iVar2,0), pFVar1 = _stderr, iVar2 < 0)) {
                uVar4 = snd_strerror(iVar2);
                fprintf(pFVar1,"%s(%i) ALSA internal error : %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/alsa_common.h"
                        ,0x96,uVar4);
                fflush(_stderr);
                exit(1);
              }
              iVar2 = snd_pcm_sw_params_set_start_threshold(local_38,local_40,local_50 - local_58);
              if ((iVar2 < 0) &&
                 (iVar2 = snd_pcm_recover(local_38,iVar2,0), pFVar1 = _stderr, iVar2 < 0)) {
                uVar4 = snd_strerror(iVar2);
                fprintf(pFVar1,"%s(%i) ALSA internal error : %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/alsa_common.h"
                        ,0x97,uVar4);
                fflush(_stderr);
                exit(1);
              }
              iVar2 = snd_pcm_sw_params_set_avail_min(local_38,local_40,local_58);
              if ((iVar2 < 0) &&
                 (iVar2 = snd_pcm_recover(local_38,iVar2,0), pFVar1 = _stderr, iVar2 < 0)) {
                uVar4 = snd_strerror(iVar2);
                fprintf(pFVar1,"%s(%i) ALSA internal error : %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/alsa_common.h"
                        ,0x98,uVar4);
                fflush(_stderr);
                exit(1);
              }
              iVar2 = snd_pcm_sw_params(local_38,local_40);
              if ((iVar2 < 0) &&
                 (iVar2 = snd_pcm_recover(local_38,iVar2,0), pFVar1 = _stderr, iVar2 < 0)) {
                uVar4 = snd_strerror(iVar2);
                fprintf(pFVar1,"%s(%i) ALSA internal error : %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/alsa_common.h"
                        ,0x99,uVar4);
                fflush(_stderr);
                exit(1);
              }
              snd_pcm_sw_params_free(local_40);
              if (local_64 == 0xe) {
                local_138 = "float";
              }
              else {
                local_138 = "s16";
                if (local_64 == 10) {
                  local_138 = "s32";
                }
              }
              printf("Opened ALSA device: %s, %s, %i Hz, %lu/%lu\n",local_48,local_138,
                     (ulong)local_60,local_58,local_50);
              *local_30 = local_38;
              *in_stack_00000008 = local_58;
              *in_stack_00000010 = local_60;
              *in_stack_00000018 = local_64;
              return;
            }
            if ((long)local_4 == local_70 + 1) {
              fprintf(_stderr,"%s: expected argument after %s\n",*local_10,local_10[local_70]);
              fflush(_stderr);
              exit(1);
            }
            lVar3 = local_70 + 1;
            iVar2 = strcmp((char *)local_10[lVar3],"float");
            if (iVar2 == 0) {
              local_64 = 0xe;
            }
            else {
              iVar2 = strcmp((char *)local_10[lVar3],"s16");
              if (iVar2 == 0) {
                local_64 = 2;
              }
              else {
                iVar2 = strcmp((char *)local_10[lVar3],"s32");
                if (iVar2 != 0) {
                  fprintf(_stderr,"%s: unknown format %s\n",*local_10,local_10[lVar3]);
                  fflush(_stderr);
                  exit(1);
                }
                local_64 = 10;
              }
            }
          }
        }
      }
    }
    local_70 = local_70 + 2;
  } while( true );
}

Assistant:

void init_alsa_device(int argc, char** argv,
                      size_t default_period_size,
                      size_t default_buffer_size,
                      int mode,
                      snd_pcm_t** out_device,
		      size_t* out_period_size,
		      unsigned int* out_rate,
                      snd_pcm_format_t* out_format) {
	snd_pcm_t* device;
	void* params;
	char* devicename = "default";
	size_t buffer_size = default_buffer_size;
	size_t period_size = default_period_size;
	const unsigned int channels = 2;
	unsigned int rate = 48000;
	snd_pcm_format_t format = SND_PCM_FORMAT_FLOAT;

	for(size_t i = 1; i < argc; ++i) {
		if(!strcmp(argv[i], "--")) {
			break;
		}

		if(!strcmp(argv[i], "--device")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			devicename = argv[i+1];
			++i;
			continue;
		}

		if(!strcmp(argv[i], "--buffer-size")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			buffer_size = (size_t)strtol(argv[i+1], NULL, 0);
			++i;
			continue;
		}

		if(!strcmp(argv[i], "--period-size")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			period_size = (size_t)strtol(argv[i+1], NULL, 0);
			++i;
			continue;
		}

		if(!strcmp(argv[i], "--rate")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			rate = (unsigned int)strtol(argv[i+1], NULL, 0);
			++i;
			continue;
		}

		if(!strcmp(argv[i], "--format")) {
			if(argc == i+1) FATAL("%s: expected argument after %s\n", argv[0], argv[i]);
			++i;

			if(!strcmp(argv[i], "float")) {
				format = SND_PCM_FORMAT_FLOAT;
				continue;
			}

			if(!strcmp(argv[i], "s16")) {
				format = SND_PCM_FORMAT_S16;
				continue;
			}

			if(!strcmp(argv[i], "s32")) {
				format = SND_PCM_FORMAT_S32;
				continue;
			}

			FATAL("%s: unknown format %s\n", argv[0], argv[i]);
		}

		break;
	}

	CHECK_ALSA_CALL(snd_pcm_open(&device, devicename, SND_PCM_STREAM_PLAYBACK, mode));
	CHECK_ALSA_CALL(snd_pcm_hw_params_malloc((snd_pcm_hw_params_t**)(&params)));
	CHECK_ALSA_CALL(snd_pcm_hw_params_any(device, params));
	CHECK_ALSA_CALL(snd_pcm_hw_params_set_access(device, params, SND_PCM_ACCESS_RW_INTERLEAVED));

	if(snd_pcm_hw_params_set_format(device, params, format) < 0
	   && snd_pcm_hw_params_set_format(device, params, format = SND_PCM_FORMAT_FLOAT) < 0
	   && snd_pcm_hw_params_set_format(device, params, format = SND_PCM_FORMAT_S32) < 0) {
		CHECK_ALSA_CALL(snd_pcm_hw_params_set_format(device, params, format = SND_PCM_FORMAT_S16));
	}

	if(snd_pcm_hw_params_set_rate(device, params, rate, 0) < 0
	   && snd_pcm_hw_params_set_rate(device, params, rate = 48000, 0) < 0) {
		CHECK_ALSA_CALL(snd_pcm_hw_params_set_rate(device, params, rate = 44100, 0));
	}

	CHECK_ALSA_CALL(snd_pcm_hw_params_set_channels(device, params, channels));

	CHECK_ALSA_CALL(snd_pcm_hw_params_set_buffer_size_near(device, params, &buffer_size));
	CHECK_ALSA_CALL(snd_pcm_hw_params_set_period_size_near(device, params, &period_size, 0));
	CHECK_ALSA_CALL(snd_pcm_hw_params(device, params));
	snd_pcm_hw_params_free(params);

	CHECK_ALSA_CALL(snd_pcm_sw_params_malloc((snd_pcm_sw_params_t**)(&params)));
	CHECK_ALSA_CALL(snd_pcm_sw_params_current(device, params));
	CHECK_ALSA_CALL(snd_pcm_sw_params_set_start_threshold(device, params, buffer_size - period_size));
	CHECK_ALSA_CALL(snd_pcm_sw_params_set_avail_min(device, params, period_size));
	CHECK_ALSA_CALL(snd_pcm_sw_params(device, params));
	snd_pcm_sw_params_free(params);

	printf("Opened ALSA device: %s, %s, %i Hz, %lu/%lu\n",
	       devicename,
	       format == SND_PCM_FORMAT_FLOAT ? "float" : (format == SND_PCM_FORMAT_S32 ? "s32" : "s16"),
	       rate,
	       period_size,
	       buffer_size
		);

	*out_device = device;
	*out_period_size = period_size;
	*out_rate = rate;
	*out_format = format;
}